

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t
validate_attr_arguments
          (_internal_exr_context *ctxt,exr_attribute_list_t *list,char *name,int32_t data_len,
          uint8_t **data_ptr,exr_attribute_t **attr)

{
  exr_result_t eVar1;
  exr_result_t eVar2;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE_00;
  char *pcVar3;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *nattr;
  exr_attribute_t *local_30;
  
  local_30 = (exr_attribute_t *)0x0;
  if (list == (exr_attribute_list_t *)0x0) {
    UNRECOVERED_JUMPTABLE_00 = ctxt->report_error;
    pcVar3 = "Invalid list pointer to attr_list_add";
  }
  else {
    if (attr != (exr_attribute_t **)0x0) {
      *attr = (exr_attribute_t *)0x0;
      if (data_len < 0) {
        UNRECOVERED_JUMPTABLE = ctxt->print_error;
        pcVar3 = "Extra data storage requested negative length (%d)";
      }
      else {
        if (data_ptr != (uint8_t **)0x0 || data_len == 0) {
          if (data_ptr != (uint8_t **)0x0) {
            *data_ptr = (uint8_t *)0x0;
          }
          if ((name != (char *)0x0) && (*name != '\0')) {
            eVar1 = exr_attr_list_find_by_name((exr_const_context_t)ctxt,list,name,&local_30);
            eVar2 = 0;
            if (eVar1 == 0) {
              if (data_len == 0 || data_ptr == (uint8_t **)0x0) {
                *attr = local_30;
                eVar2 = -1;
              }
              else {
                eVar2 = (*ctxt->print_error)
                                  (ctxt,3,
                                   "Attribute \'%s\' (type %s) already in list but requesting additional data"
                                   ,name,local_30->type_name);
              }
            }
            return eVar2;
          }
          UNRECOVERED_JUMPTABLE_00 = ctxt->report_error;
          pcVar3 = "Invalid name to add_by_type";
          goto LAB_00110de3;
        }
        UNRECOVERED_JUMPTABLE = ctxt->print_error;
        pcVar3 = 
        "Extra data storage output pointer must be provided when requesting extra data (%d)";
      }
      eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar3,(ulong)(uint)data_len,UNRECOVERED_JUMPTABLE);
      return eVar1;
    }
    UNRECOVERED_JUMPTABLE_00 = ctxt->report_error;
    pcVar3 = "Invalid output attribute pointer location to attr_list_add";
  }
LAB_00110de3:
  eVar1 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar3);
  return eVar1;
}

Assistant:

static exr_result_t
validate_attr_arguments (
    struct _internal_exr_context* ctxt,
    exr_attribute_list_t*         list,
    const char*                   name,
    int32_t                       data_len,
    uint8_t**                     data_ptr,
    exr_attribute_t**             attr)
{
    exr_attribute_t* nattr = NULL;
    exr_result_t     rv;
    if (!list)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer to attr_list_add");
    }

    if (!attr)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid output attribute pointer location to attr_list_add");
    }

    *attr = NULL;

    if (data_len < 0)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Extra data storage requested negative length (%d)",
            data_len);
    }
    else if (data_len > 0 && !data_ptr)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Extra data storage output pointer must be provided when requesting extra data (%d)",
            data_len);
    }
    else if (data_ptr)
        *data_ptr = NULL;

    if (!name || name[0] == '\0')
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid name to add_by_type");
    }

    /* is it already in the list? */
    rv = exr_attr_list_find_by_name (
        (exr_const_context_t) ctxt, list, name, &nattr);

    if (rv == EXR_ERR_SUCCESS)
    {
        if (data_ptr && data_len > 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Attribute '%s' (type %s) already in list but requesting additional data",
                name,
                nattr->type_name);
        }

        *attr = nattr;
        return -1;
    }

    return EXR_ERR_SUCCESS;
}